

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

string * __thiscall
setup::filename_map::expand_variables
          (string *__return_storage_ptr__,filename_map *this,it *begin,it end,bool close)

{
  char *pcVar1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  char cVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  it __last;
  size_type sVar8;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  do {
    while( true ) {
      __first._M_current = begin->_M_current;
      _Var7._M_current = __first._M_current;
      if (__first._M_current == end._M_current) {
        return __return_storage_ptr__;
      }
      for (; ((__last._M_current = end._M_current, _Var7._M_current != end._M_current &&
              (__last._M_current = _Var7._M_current, *_Var7._M_current != '{')) &&
             (*_Var7._M_current != '}')); _Var7._M_current = _Var7._M_current + 1) {
      }
      sVar8 = __return_storage_ptr__->_M_string_length;
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)__return_storage_ptr__,__first,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__last._M_current);
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar4 = __return_storage_ptr__->_M_string_length;
      for (; sVar4 != sVar8; sVar8 = sVar8 + 1) {
        cVar2 = pcVar3[sVar8];
        bVar5 = anon_unknown_0::is_unsafe_path_char::operator()
                          ((is_unsafe_path_char *)(ulong)(uint)(int)cVar2,(char)__first._M_current);
        cVar6 = '$';
        if (!bVar5) {
          cVar6 = cVar2;
        }
        pcVar3[sVar8] = cVar6;
      }
      begin->_M_current = __last._M_current;
      if (__last._M_current == end._M_current) {
        return __return_storage_ptr__;
      }
      pcVar1 = __last._M_current + 1;
      begin->_M_current = pcVar1;
      if (!close) break;
      if (*__last._M_current == '}') {
        return __return_storage_ptr__;
      }
LAB_00130dd2:
      if ((pcVar1 == end._M_current) || (*pcVar1 != '{')) {
        expand_variables(&local_70,this,begin,end,true);
        lookup(&local_50,this,&local_70);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        begin->_M_current = begin->_M_current + 1;
      }
    }
    if (*__last._M_current != '}') goto LAB_00130dd2;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  } while( true );
}

Assistant:

std::string filename_map::expand_variables(it & begin, it end, bool close) const {
	
	std::string result;
	result.reserve(size_t(end - begin));
	
	while(begin != end) {
		
		// Flush everything before the next bracket
		it pos = begin;
		while(pos != end && *pos != '{' && *pos != '}') {
			++pos;
		}
		ptrdiff_t obegin = ptrdiff_t(result.size());
		result.append(begin, pos);
		std::replace_copy_if(result.begin() + obegin, result.end(), result.begin() + obegin,
		                     is_unsafe_path_char(), '$');
		begin = pos;
		
		if(pos == end) {
			// No more variables or escape sequences
			break;
		}
		
		begin++;
		
		if(close && *pos == '}') {
			// Current context closed
			break;
		}
		
		if(!close && *pos == '}') {
			// literal '}' character
			result.push_back('}');
			continue;
		}
		
		// '{{' escape sequence
		if(begin != end && *begin == '{') {
			result.push_back('{');
			begin++;
			continue;
		}
		
		// Recursively expand variables until we reach the end of this context
		result.append(lookup(expand_variables(begin, end, true)));
	}
	
	return result;
}